

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::TracingMuxerImpl::InitializeConsumer
          (TracingMuxerImpl *this,TracingSessionGlobalID session_id)

{
  uint uVar1;
  ulong __n;
  code *pcVar2;
  ConsumerImpl *this_00;
  size_type sVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  unique_ptr<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_> local_48;
  undefined1 local_40 [8];
  ConnectConsumerArgs conn_args;
  RegisteredBackend *backend;
  TracingBackendId backend_id;
  ConsumerImpl *consumer;
  TracingSessionGlobalID session_id_local;
  TracingMuxerImpl *this_local;
  
  this_00 = FindConsumer(this,session_id);
  if (this_00 != (ConsumerImpl *)0x0) {
    __n = this_00->backend_id_;
    sVar3 = std::
            vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
            ::size(&this->backends_);
    if (sVar3 <= __n) {
      fname = perfetto::base::Basename
                        (
                        "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                        );
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      perfetto::base::LogMessage
                (kLogError,fname,0xacfb,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(backend_id < backends_.size())",(ulong)uVar1,pcVar6);
      perfetto::base::MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    conn_args.task_runner =
         (TaskRunner *)
         std::
         vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
         ::operator[](&this->backends_,__n);
    TracingBackend::ConnectConsumerArgs::ConnectConsumerArgs((ConnectConsumerArgs *)local_40);
    local_40 = (undefined1  [8])this_00;
    conn_args.consumer =
         (Consumer *)
         std::
         unique_ptr<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>::
         get(&this->task_runner_);
    (**(code **)(*(conn_args.task_runner)->_vptr_TaskRunner + 0x18))
              (&local_48,(conn_args.task_runner)->_vptr_TaskRunner,local_40);
    ConsumerImpl::Initialize(this_00,&local_48);
    std::unique_ptr<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>::
    ~unique_ptr(&local_48);
  }
  return;
}

Assistant:

void TracingMuxerImpl::InitializeConsumer(TracingSessionGlobalID session_id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  auto* consumer = FindConsumer(session_id);
  if (!consumer)
    return;

  TracingBackendId backend_id = consumer->backend_id_;
  // |backends_| is append-only, Backend instances are always valid.
  PERFETTO_CHECK(backend_id < backends_.size());
  RegisteredBackend& backend = backends_[backend_id];

  TracingBackend::ConnectConsumerArgs conn_args;
  conn_args.consumer = consumer;
  conn_args.task_runner = task_runner_.get();
  consumer->Initialize(backend.backend->ConnectConsumer(conn_args));
}